

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.cxx
# Opt level: O3

void __thiscall cmTryRunCommand::RunExecutable(cmTryRunCommand *this,string *runArgs,string *out)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *path;
  char *extraout_RDX_01;
  pointer pbVar3;
  int retVal;
  string finalCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  string emulator;
  char retChar [1000];
  uint local_47c;
  char *local_478;
  undefined8 local_470;
  char local_468;
  undefined7 uStack_467;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_458;
  string *local_440;
  string local_438;
  string local_418 [31];
  
  local_47c = 0xffffffff;
  local_478 = &local_468;
  local_470 = 0;
  local_468 = '\0';
  this_00 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
  local_418[0]._M_dataplus._M_p._0_6_ = SUB86(&local_418[0].field_2,0);
  local_418[0]._M_dataplus._M_p._6_2_ = (undefined2)((ulong)&local_418[0].field_2 >> 0x30);
  local_440 = runArgs;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_418,"CMAKE_CROSSCOMPILING_EMULATOR","");
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,local_418);
  std::__cxx11::string::string((string *)&local_438,pcVar2,(allocator *)&local_458);
  pcVar2 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT26(local_418[0]._M_dataplus._M_p._6_2_,local_418[0]._M_dataplus._M_p._0_6_) !=
      &local_418[0].field_2) {
    operator_delete((undefined1 *)
                    CONCAT26(local_418[0]._M_dataplus._M_p._6_2_,local_418[0]._M_dataplus._M_p._0_6_
                            ),local_418[0].field_2._M_allocated_capacity + 1);
    pcVar2 = extraout_RDX_00;
  }
  if (local_438._M_string_length != 0) {
    local_458.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_458.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_458.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::ExpandListArgument(&local_438,&local_458,false);
    cmSystemTools::ConvertToRunCommandPath_abi_cxx11_
              (local_418,
               (cmSystemTools *)
               ((local_458.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,path);
    std::__cxx11::string::_M_append
              ((char *)&local_478,
               CONCAT26(local_418[0]._M_dataplus._M_p._6_2_,local_418[0]._M_dataplus._M_p._0_6_));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT26(local_418[0]._M_dataplus._M_p._6_2_,local_418[0]._M_dataplus._M_p._0_6_) !=
        &local_418[0].field_2) {
      operator_delete((undefined1 *)
                      CONCAT26(local_418[0]._M_dataplus._M_p._6_2_,
                               local_418[0]._M_dataplus._M_p._0_6_),
                      local_418[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_478);
    pbVar3 = local_458.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (pbVar3 = pbVar3 + 1,
          pbVar3 != local_458.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)&local_478);
      std::__cxx11::string::_M_append((char *)&local_478,(ulong)(pbVar3->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_478);
      std::__cxx11::string::append((char *)&local_478);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_458);
    pcVar2 = extraout_RDX_01;
  }
  cmSystemTools::ConvertToRunCommandPath_abi_cxx11_
            (local_418,(cmSystemTools *)(this->super_cmCoreTryCompile).OutputFile._M_dataplus._M_p,
             pcVar2);
  std::__cxx11::string::_M_append
            ((char *)&local_478,
             CONCAT26(local_418[0]._M_dataplus._M_p._6_2_,local_418[0]._M_dataplus._M_p._0_6_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT26(local_418[0]._M_dataplus._M_p._6_2_,local_418[0]._M_dataplus._M_p._0_6_) !=
      &local_418[0].field_2) {
    operator_delete((undefined1 *)
                    CONCAT26(local_418[0]._M_dataplus._M_p._6_2_,local_418[0]._M_dataplus._M_p._0_6_
                            ),local_418[0].field_2._M_allocated_capacity + 1);
  }
  if (local_440->_M_string_length != 0) {
    std::__cxx11::string::_M_append((char *)&local_478,(ulong)(local_440->_M_dataplus)._M_p);
  }
  bVar1 = cmSystemTools::RunSingleCommand
                    (local_478,out,out,(int *)&local_47c,(char *)0x0,OUTPUT_NONE,0.0);
  if (bVar1) {
    sprintf((char *)local_418,"%i",(ulong)local_47c);
  }
  else {
    local_418[0]._M_string_length._0_6_ = 0x4e55525f4f;
    local_418[0]._M_dataplus._M_p._0_6_ = 0x44454c494146;
    local_418[0]._M_dataplus._M_p._6_2_ = 0x545f;
  }
  cmMakefile::AddCacheDefinition
            ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,&this->RunResultVariable,
             (char *)local_418,"Result of TRY_RUN",INTERNAL,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if (local_478 != &local_468) {
    operator_delete(local_478,CONCAT71(uStack_467,local_468) + 1);
  }
  return;
}

Assistant:

void cmTryRunCommand::RunExecutable(const std::string& runArgs,
                                    std::string* out)
{
  int retVal = -1;

  std::string finalCommand;
  const std::string emulator =
  this->Makefile->GetSafeDefinition("CMAKE_CROSSCOMPILING_EMULATOR");
  if (!emulator.empty())
    {
    std::vector<std::string> emulatorWithArgs;
    cmSystemTools::ExpandListArgument(emulator, emulatorWithArgs);
    finalCommand += cmSystemTools::ConvertToRunCommandPath(
                                 emulatorWithArgs[0].c_str());
    finalCommand += " ";
    for (std::vector<std::string>::const_iterator ei =
         emulatorWithArgs.begin()+1;
         ei != emulatorWithArgs.end(); ++ei)
      {
      finalCommand += "\"";
      finalCommand += *ei;
      finalCommand += "\"";
      finalCommand += " ";
      }
    }
  finalCommand += cmSystemTools::ConvertToRunCommandPath(
                               this->OutputFile.c_str());
  if (!runArgs.empty())
    {
    finalCommand += runArgs;
    }
  int timeout = 0;
  bool worked = cmSystemTools::RunSingleCommand(finalCommand.c_str(),
                out, out, &retVal,
                0, cmSystemTools::OUTPUT_NONE, timeout);
  // set the run var
  char retChar[1000];
  if (worked)
    {
    sprintf(retChar, "%i", retVal);
    }
  else
    {
    strcpy(retChar, "FAILED_TO_RUN");
    }
  this->Makefile->AddCacheDefinition(this->RunResultVariable, retChar,
                                     "Result of TRY_RUN",
                                     cmState::INTERNAL);
}